

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int tlp_calculate_length(uintptr_t addr,size_t count)

{
  uintptr_t end;
  uintptr_t start;
  size_t len;
  size_t count_local;
  uintptr_t addr_local;
  
  len._0_4_ = (int)((addr + count) - (addr & 0xfffffffffffffffc) >> 2);
  if ((addr + count & 3) != 0) {
    len._0_4_ = (int)len + 1;
  }
  return (int)len;
}

Assistant:

int tlp_calculate_length(uintptr_t addr, size_t count)
{
	size_t len = 0;
	uintptr_t start, end;

	start = addr & 0xFFFFFFFFFFFFFFFc;
	end = addr + count;

	len = (end - start) >> 2;

	if ((end - start) & 0x3)
		len++;

	return len;
}